

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::TrackIfSurrogatePair
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,codepoint_t codePoint,
          EncodedChar *location,uint32 consumptionLength)

{
  code *pcVar1;
  bool bVar2;
  codepoint_t cVar3;
  undefined4 *puVar4;
  SurrogatePairTracker *this_00;
  EncodedChar *location_00;
  SurrogatePairTracker **ppSVar5;
  
  if (0x10ffff < codePoint) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x13d,"(codePoint < 0x110000)","codePoint < 0x110000");
    if (!bVar2) goto LAB_00eb8770;
    *puVar4 = 0;
  }
  if (location == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x13e,"(location != nullptr)","location != nullptr");
    if (!bVar2) goto LAB_00eb8770;
    *puVar4 = 0;
  }
  if (this->tempLocationOfSurrogatePair == location) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x13f,"(location != this->tempLocationOfSurrogatePair)",
                       "location != this->tempLocationOfSurrogatePair");
    if (!bVar2) goto LAB_00eb8770;
    *puVar4 = 0;
  }
  bVar2 = Js::NumberUtilities::IsSurrogateLowerPart(codePoint);
  location_00 = location;
  cVar3 = codePoint;
  if (!bVar2) {
    bVar2 = Js::NumberUtilities::IsSurrogateUpperPart(codePoint);
    if ((bVar2) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
      bVar2 = Js::NumberUtilities::IsSurrogateLowerPart(this->codePointAtTempLocation);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x14a,
                           "(Js::NumberUtilities::IsSurrogateLowerPart(codePointAtTempLocation))",
                           "Js::NumberUtilities::IsSurrogateLowerPart(codePointAtTempLocation)");
        if (!bVar2) goto LAB_00eb8770;
        *puVar4 = 0;
      }
      consumptionLength =
           (int)((ulong)((long)location - (long)this->tempLocationOfSurrogatePair) >> 1) +
           consumptionLength;
      codePoint = Js::NumberUtilities::SurrogatePairAsCodePoint
                            (this->codePointAtTempLocation,codePoint);
      location_00 = this->tempLocationOfSurrogatePair;
    }
    location = (EncodedChar *)0x0;
    cVar3 = 0;
  }
  this->tempLocationOfSurrogatePair = location;
  this->codePointAtTempLocation = cVar3;
  if (0xffff < codePoint) {
    this->positionAfterLastSurrogate = location_00 + consumptionLength;
    this->valueOfLastSurrogate = codePoint;
    if (this->ctAllocator != (ArenaAllocator *)0x0) {
      this_00 = (SurrogatePairTracker *)new<Memory::ArenaAllocator>(0x28,this->ctAllocator,0x366bee)
      ;
      SurrogatePairTracker::SurrogatePairTracker
                (this_00,location_00,this->tempLocationOfRange,codePoint,consumptionLength,0);
      if (this->surrogatePairList == (SurrogatePairTracker *)0x0) {
        ppSVar5 = &this->surrogatePairList;
        if (this->currentSurrogatePairNode != (SurrogatePairTracker *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x160,"(currentSurrogatePairNode == nullptr)",
                             "currentSurrogatePairNode == nullptr");
          if (!bVar2) goto LAB_00eb8770;
          *puVar4 = 0;
        }
      }
      else {
        if (this->currentSurrogatePairNode == (SurrogatePairTracker *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x166,"(currentSurrogatePairNode != nullptr)",
                             "currentSurrogatePairNode != nullptr");
          if (!bVar2) {
LAB_00eb8770:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        ppSVar5 = &this->currentSurrogatePairNode->next;
      }
      *ppSVar5 = this_00;
      this->currentSurrogatePairNode = this_00;
    }
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>:: TrackIfSurrogatePair(codepoint_t codePoint,  const EncodedChar* location, uint32 consumptionLength)
    {
        Assert(codePoint < 0x110000);
        Assert(location != nullptr);
        Assert(location != this->tempLocationOfSurrogatePair);

        if (Js::NumberUtilities::IsSurrogateLowerPart(codePoint))
        {
            this->tempLocationOfSurrogatePair = location;
            this->codePointAtTempLocation = codePoint;
        }
        else
        {
            if(Js::NumberUtilities::IsSurrogateUpperPart(codePoint) && this->tempLocationOfSurrogatePair != nullptr)
            {
                Assert(Js::NumberUtilities::IsSurrogateLowerPart(codePointAtTempLocation));
                consumptionLength = (uint32)(location - this->tempLocationOfSurrogatePair) + consumptionLength;
                codePoint = Js::NumberUtilities::SurrogatePairAsCodePoint(codePointAtTempLocation, codePoint);
                location = this->tempLocationOfSurrogatePair;
            }
            // At this point we can clear previous location, and then if codePoint is bigger than 0xFFFF store it, as we either received it or combined it above
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (codePoint > 0xFFFF)
        {
            this->positionAfterLastSurrogate = location + consumptionLength;
            this->valueOfLastSurrogate = codePoint;

            // When parsing without AST we aren't given an allocator. In addition, only the 2 lines above are used during Pass 0;
            // while the bottom is used during Pass 1 (which isn't done when ParseNoAST)
            if(this->ctAllocator != nullptr)
            {
                SurrogatePairTracker* node = Anew(this->ctAllocator, SurrogatePairTracker, location, this->tempLocationOfRange, codePoint, consumptionLength, this->m_cMultiUnits);
                if (surrogatePairList == nullptr)
                {
                    Assert(currentSurrogatePairNode == nullptr);
                    surrogatePairList = node;
                    currentSurrogatePairNode = node;
                }
                else
                {
                    Assert(currentSurrogatePairNode != nullptr);
                    currentSurrogatePairNode->next = node;
                    currentSurrogatePairNode = node;
                }
            }
        }
    }